

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.h
# Opt level: O2

bool __thiscall Assimp::ColladaMeshIndex::operator<(ColladaMeshIndex *this,ColladaMeshIndex *p)

{
  __type _Var1;
  bool bVar2;
  
  _Var1 = std::operator==(&this->mMeshID,&p->mMeshID);
  if (_Var1) {
    if (this->mSubMesh != p->mSubMesh) {
      return this->mSubMesh < p->mSubMesh;
    }
    this = (ColladaMeshIndex *)&this->mMaterial;
    p = (ColladaMeshIndex *)&p->mMaterial;
  }
  bVar2 = std::operator<(&this->mMeshID,&p->mMeshID);
  return bVar2;
}

Assistant:

bool operator < (const ColladaMeshIndex& p) const
    {
        if( mMeshID == p.mMeshID)
        {
            if( mSubMesh == p.mSubMesh)
                return mMaterial < p.mMaterial;
            else
                return mSubMesh < p.mSubMesh;
        } else
        {
            return mMeshID < p.mMeshID;
        }
    }